

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O2

void __thiscall Pl_AES_PDF::flush(Pl_AES_PDF *this,bool strip_padding)

{
  byte bVar1;
  Pipeline *pPVar2;
  element_type *peVar3;
  bool bVar4;
  undefined8 uVar5;
  long lVar6;
  logic_error *this_00;
  long lVar7;
  long lVar8;
  
  if (this->offset != 0x10) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"AES pipeline: flush called when buffer was not full");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (this->first == true) {
    this->first = false;
    bVar4 = true;
    if (this->cbc_mode == true) {
      if (this->encrypt == true) {
        initializeVector(this);
        if ((this->use_zero_iv == false) && (this->use_specified_iv == false)) {
          pPVar2 = (this->super_Pipeline).next_;
          (*pPVar2->_vptr_Pipeline[2])(pPVar2,this->cbc_block,0x10);
        }
      }
      else if ((this->use_zero_iv == false) && (this->use_specified_iv != true)) {
        uVar5 = *(undefined8 *)(this->inbuf + 8);
        *(undefined8 *)this->cbc_block = *(undefined8 *)this->inbuf;
        *(undefined8 *)(this->cbc_block + 8) = uVar5;
        this->offset = 0;
        bVar4 = false;
      }
      else {
        initializeVector(this);
      }
    }
    peVar3 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_QPDFCryptoImpl[0xe])
              (peVar3,(ulong)this->encrypt,
               (this->key)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,this->key_bytes,
               (ulong)this->cbc_mode,this->cbc_block);
    if (!bVar4) {
      return;
    }
  }
  peVar3 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar3->_vptr_QPDFCryptoImpl[0xf])(peVar3,this->inbuf,this->outbuf);
  lVar7 = 0x10;
  if (strip_padding) {
    bVar1 = this->outbuf[0xf];
    if (bVar1 < 0x11) {
      lVar8 = 0;
      do {
        if (-lVar8 == (ulong)(uint)bVar1) {
          lVar7 = 0x10 - (ulong)bVar1;
          break;
        }
        lVar6 = lVar8 + 0xf;
        lVar8 = lVar8 + -1;
      } while (this->outbuf[lVar6] == bVar1);
    }
  }
  this->offset = 0;
  pPVar2 = (this->super_Pipeline).next_;
  (*pPVar2->_vptr_Pipeline[2])(pPVar2,this->outbuf,lVar7);
  return;
}

Assistant:

void
Pl_AES_PDF::flush(bool strip_padding)
{
    if (this->offset != this->buf_size) {
        throw std::logic_error("AES pipeline: flush called when buffer was not full");
    }

    if (first) {
        first = false;
        bool return_after_init = false;
        if (this->cbc_mode) {
            if (encrypt) {
                // Set cbc_block to the initialization vector, and if not zero, write it to the
                // output stream.
                initializeVector();
                if (!(this->use_zero_iv || this->use_specified_iv)) {
                    next()->write(this->cbc_block, this->buf_size);
                }
            } else if (this->use_zero_iv || this->use_specified_iv) {
                // Initialize vector with zeroes; zero vector was not written to the beginning of
                // the input file.
                initializeVector();
            } else {
                // Take the first block of input as the initialization vector.  There's nothing to
                // write at this time.
                memcpy(this->cbc_block, this->inbuf, this->buf_size);
                this->offset = 0;
                return_after_init = true;
            }
        }
        this->crypto->rijndael_init(
            encrypt, this->key.get(), key_bytes, this->cbc_mode, this->cbc_block);
        if (return_after_init) {
            return;
        }
    }

    this->crypto->rijndael_process(this->inbuf, this->outbuf);
    unsigned int bytes = this->buf_size;
    if (strip_padding) {
        unsigned char last = this->outbuf[this->buf_size - 1];
        if (last <= this->buf_size) {
            bool strip = true;
            for (unsigned int i = 1; i <= last; ++i) {
                if (this->outbuf[this->buf_size - i] != last) {
                    strip = false;
                    break;
                }
            }
            if (strip) {
                bytes -= last;
            }
        }
    }
    this->offset = 0;
    next()->write(this->outbuf, bytes);
}